

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBExtractAlpha(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_a,int dst_stride_a,int width
                    ,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int y;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *ARGBExtractAlphaRow;
  undefined8 in_stack_ffffffffffffffb0;
  int test_flag;
  code *local_48;
  int local_3c;
  code *local_38;
  int local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_2c = in_R9D;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_2c = -in_R9D;
      local_10 = in_RDI + (local_2c + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D << 2) && (in_ECX == in_R8D)) {
      local_28 = local_2c * in_R8D;
      local_2c = 1;
      local_24 = 0;
      local_14 = 0;
    }
    local_38 = ARGBExtractAlphaRow_C;
    test_flag = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    iVar1 = libyuv::TestCpuFlag(test_flag);
    if (iVar1 != 0) {
      if ((local_28 & 7) == 0) {
        local_48 = ARGBExtractAlphaRow_SSE2;
      }
      else {
        local_48 = ARGBExtractAlphaRow_Any_SSE2;
      }
      local_38 = local_48;
    }
    iVar1 = libyuv::TestCpuFlag(test_flag);
    if (iVar1 != 0) {
      if ((local_28 & 0x1f) == 0) {
        local_38 = ARGBExtractAlphaRow_AVX2;
      }
      else {
        local_38 = ARGBExtractAlphaRow_Any_AVX2;
      }
    }
    local_20 = in_RDX;
    for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
      (*local_38)(local_10,local_20,local_28);
      local_10 = local_10 + local_14;
      local_20 = local_20 + (int)local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBExtractAlpha(const uint8_t* src_argb,
                     int src_stride_argb,
                     uint8_t* dst_a,
                     int dst_stride_a,
                     int width,
                     int height) {
  if (!src_argb || !dst_a || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb += (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_a == width) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_a = 0;
  }
  void (*ARGBExtractAlphaRow)(const uint8_t* src_argb, uint8_t* dst_a,
                              int width) = ARGBExtractAlphaRow_C;
#if defined(HAS_ARGBEXTRACTALPHAROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBExtractAlphaRow = IS_ALIGNED(width, 8) ? ARGBExtractAlphaRow_SSE2
                                               : ARGBExtractAlphaRow_Any_SSE2;
  }
#endif
#if defined(HAS_ARGBEXTRACTALPHAROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBExtractAlphaRow = IS_ALIGNED(width, 32) ? ARGBExtractAlphaRow_AVX2
                                                : ARGBExtractAlphaRow_Any_AVX2;
  }
#endif
#if defined(HAS_ARGBEXTRACTALPHAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBExtractAlphaRow = IS_ALIGNED(width, 16) ? ARGBExtractAlphaRow_NEON
                                                : ARGBExtractAlphaRow_Any_NEON;
  }
#endif
#if defined(HAS_ARGBEXTRACTALPHAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBExtractAlphaRow = IS_ALIGNED(width, 8) ? ARGBExtractAlphaRow_MMI
                                               : ARGBExtractAlphaRow_Any_MMI;
  }
#endif
#if defined(HAS_ARGBEXTRACTALPHAROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBExtractAlphaRow = IS_ALIGNED(width, 16) ? ARGBExtractAlphaRow_MSA
                                                : ARGBExtractAlphaRow_Any_MSA;
  }
#endif

  for (int y = 0; y < height; ++y) {
    ARGBExtractAlphaRow(src_argb, dst_a, width);
    src_argb += src_stride_argb;
    dst_a += dst_stride_a;
  }
  return 0;
}